

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

Gia_Man_t * Gia_ManSeqStructSweep(Gia_Man_t *p,int fConst,int fEquiv,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pTemp;
  int fVerbose_local;
  int fEquiv_local;
  int fConst_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 == 0) {
    p_local = Gia_ManCleanup(p);
  }
  else {
    if (fVerbose != 0) {
      printf("Performing sequential cleanup.\n");
    }
    pGVar2 = Gia_ManSeqCleanup(p);
    if (fVerbose != 0) {
      Gia_ManReportImprovement(p,pGVar2);
    }
    _fEquiv_local = pGVar2;
    if ((fConst != 0) && (iVar1 = Gia_ManRegNum(pGVar2), iVar1 != 0)) {
      _fEquiv_local = Gia_ManReduceConst(pGVar2,fVerbose);
      if (fVerbose != 0) {
        Gia_ManReportImprovement(pGVar2,_fEquiv_local);
      }
      Gia_ManStop(pGVar2);
    }
    if ((fVerbose != 0) && (fEquiv != 0)) {
      printf("Merging combinationally equivalent flops.\n");
    }
    if (fEquiv != 0) {
      while( true ) {
        pGVar2 = Gia_ManSeqCleanup(_fEquiv_local);
        if (fVerbose != 0) {
          Gia_ManReportImprovement(_fEquiv_local,pGVar2);
        }
        Gia_ManStop(_fEquiv_local);
        iVar1 = Gia_ManRegNum(pGVar2);
        _fEquiv_local = pGVar2;
        if ((iVar1 == 0) ||
           (_fEquiv_local = Gia_ManReduceEquiv(pGVar2,fVerbose), _fEquiv_local == pGVar2)) break;
        Gia_ManStop(pGVar2);
      }
    }
    p_local = _fEquiv_local;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSeqStructSweep( Gia_Man_t * p, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pTemp;
    if ( Gia_ManRegNum(p) == 0 )
        return Gia_ManCleanup( p );
    if ( fVerbose )
        printf( "Performing sequential cleanup.\n" );
    p = Gia_ManSeqCleanup( pTemp = p );
    if ( fVerbose )
        Gia_ManReportImprovement( pTemp, p );
    if ( fConst && Gia_ManRegNum(p) )
    {
        p = Gia_ManReduceConst( pTemp = p, fVerbose );
        if ( fVerbose )
            Gia_ManReportImprovement( pTemp, p );
        Gia_ManStop( pTemp );
    }
    if ( fVerbose && fEquiv )
        printf( "Merging combinationally equivalent flops.\n" );
    if ( fEquiv )
    while ( 1 )
    {
        p = Gia_ManSeqCleanup( pTemp = p );
        if ( fVerbose )
            Gia_ManReportImprovement( pTemp, p );
        Gia_ManStop( pTemp );
        if ( Gia_ManRegNum(p) == 0 )
            break;
        p = Gia_ManReduceEquiv( pTemp = p, fVerbose );
        if ( p == pTemp )
            break;
        Gia_ManStop( pTemp );
    }
    return p;
}